

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int coda_inflateValidate(z_streamp strm,int check)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar1 = inflateStateCheck(strm);
  iVar2 = -2;
  if (iVar1 == 0) {
    uVar3 = *(uint *)(strm->state + 0x10);
    if (check == 0) {
      uVar3 = uVar3 & 0xfffffffb;
    }
    else if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = uVar3 | 4;
    }
    *(uint *)(strm->state + 0x10) = uVar3;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ZEXPORT inflateValidate(z_streamp strm, int check) {
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (check && state->wrap)
        state->wrap |= 4;
    else
        state->wrap &= ~4;
    return Z_OK;
}